

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_CCtx *__s;
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  long lVar3;
  ZSTD_cwksp *pZVar4;
  ZSTD_cwksp *pZVar5;
  ZSTD_cwksp *ws;
  byte bVar6;
  ZSTD_cpuid_t ZVar7;
  ZSTD_cwksp local_60;
  
  bVar6 = 0;
  if (((ulong)workspace & 7) == 0 && 0x1478 < workspaceSize) {
    ZSTD_cwksp_init(&local_60,workspace,workspaceSize,ZSTD_cwksp_static_alloc);
    __s = (ZSTD_CCtx *)ZSTD_cwksp_reserve_object(&local_60,0x1478);
    if (__s != (ZSTD_CCtx *)0x0) {
      memset(__s,0,0x1478);
      ws = &__s->workspace;
      pZVar4 = &local_60;
      pZVar5 = ws;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        pZVar5->workspace = pZVar4->workspace;
        pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pZVar5 = (ZSTD_cwksp *)((long)pZVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      __s->staticSize = workspaceSize;
      if (0x4ed7 < (ulong)((long)(__s->workspace).allocStart - (long)(__s->workspace).tableEnd)) {
        pZVar1 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
        (__s->blockState).prevCBlock = pZVar1;
        pZVar1 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
        (__s->blockState).nextCBlock = pZVar1;
        pUVar2 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
        __s->entropyWorkspace = pUVar2;
        ZVar7 = ZSTD_cpuid();
        __s->bmi2 = ZVar7.f1c >> 8 & 1;
        return __s;
      }
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}